

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5ApiQueryPhrase(Fts5Context *pCtx,int iPhrase,void *pUserData,
                      _func_int_Fts5ExtensionApi_ptr_Fts5Context_ptr_void_ptr *xCallback)

{
  int *__src;
  char *__s;
  Fts5Config *pFVar1;
  int iVar2;
  int iVar3;
  Fts5Expr *p;
  Fts5ExprPhrase **ppFVar4;
  Fts5ExprNode *pFVar5;
  Fts5ExprNearset *pFVar6;
  Fts5Colset *__dest;
  size_t sVar7;
  Fts5ExprPhrase *pPhrase;
  code *pcVar8;
  long lVar9;
  Fts5Cursor *pCursor;
  int in_R8D;
  int in_R9D;
  undefined8 *puVar10;
  long *plVar11;
  Fts5FullTable *pTab;
  int local_9c;
  Fts5Cursor *local_98;
  undefined8 *local_90;
  long *local_88;
  Fts5Expr *local_80;
  Fts5ExprPhrase *local_78;
  undefined8 uStack_70;
  Fts5FullTable *local_68;
  void *local_60;
  _func_int_Fts5ExtensionApi_ptr_Fts5Context_ptr_void_ptr *local_58;
  long *local_50;
  long *local_48;
  long local_40;
  Fts5Cursor *pNew;
  
  pTab = *(Fts5FullTable **)pCtx;
  pNew = (Fts5Cursor *)0x0;
  local_60 = pUserData;
  local_58 = xCallback;
  iVar2 = fts5OpenMethod((sqlite3_vtab *)pTab,(sqlite3_vtab_cursor **)&pNew);
  pCursor = pNew;
  if (iVar2 == 0) {
    pNew->ePlan = 1;
    pNew->iFirstRowid = -0x8000000000000000;
    pNew->iLastRowid = 0x7fffffffffffffff;
    local_98 = pNew;
    (pNew->base).pVtab = (sqlite3_vtab *)pTab;
    puVar10 = *(undefined8 **)(pCtx + 0x40);
    local_9c = 0;
    local_78 = (Fts5ExprPhrase *)0x0;
    uStack_70 = 0;
    plVar11 = *(long **)(puVar10[4] + (long)iPhrase * 8);
    p = (Fts5Expr *)sqlite3Fts5MallocZero(&local_9c,0x28);
    if (local_9c == 0) {
      ppFVar4 = (Fts5ExprPhrase **)sqlite3Fts5MallocZero(&local_9c,8);
      p->apExprPhrase = ppFVar4;
      if (local_9c == 0) {
        pFVar5 = (Fts5ExprNode *)sqlite3Fts5MallocZero(&local_9c,0x38);
        p->pRoot = pFVar5;
        if (local_9c == 0) {
          pFVar6 = (Fts5ExprNearset *)sqlite3Fts5MallocZero(&local_9c,0x28);
          p->pRoot->pNear = pFVar6;
          if ((local_9c == 0) &&
             (__src = *(int **)(*(long *)(*plVar11 + 0x20) + 8), __src != (int *)0x0)) {
            sVar7 = (long)*__src * 4 + 4;
            local_90 = puVar10;
            __dest = (Fts5Colset *)sqlite3Fts5MallocZero(&local_9c,sVar7);
            if (__dest != (Fts5Colset *)0x0) {
              memcpy(__dest,__src,sVar7);
            }
            p->pRoot->pNear->pColset = __dest;
            puVar10 = local_90;
          }
        }
      }
    }
    local_88 = plVar11;
    if ((int)plVar11[3] == 0) {
      pPhrase = (Fts5ExprPhrase *)sqlite3Fts5MallocZero(&local_9c,0x40);
      iVar2 = local_9c;
      if (local_9c == 0) {
        iVar2 = (int)local_88[3];
LAB_00194592:
        pFVar1 = (Fts5Config *)puVar10[1];
        p->pIndex = (Fts5Index *)*puVar10;
        p->pConfig = pFVar1;
        p->nPhrase = 1;
        *p->apExprPhrase = pPhrase;
        p->pRoot->pNear->apPhrase[0] = pPhrase;
        pFVar5 = p->pRoot;
        pFVar5->pNear->nPhrase = 1;
        pPhrase->pNode = pFVar5;
        if (((iVar2 == 1) && (local_88[7] == 0)) && (*(char *)((long)local_88 + 0x21) == '\0')) {
          pcVar8 = fts5ExprNodeNext_TERM;
          iVar2 = 4;
        }
        else {
          pcVar8 = fts5ExprNodeNext_STRING;
          iVar2 = 9;
        }
        pFVar5->eType = iVar2;
        pFVar5->xNext = pcVar8;
        local_98->pExpr = p;
        iVar2 = fts5CursorFirst(pTab,local_98,0);
        pCursor = local_98;
        while (iVar2 == 0) {
          if ((pCursor->csrflags & 1) != 0) {
            iVar2 = 0;
            break;
          }
          iVar3 = (*local_58)(&sFts5Api,(Fts5Context *)pCursor,local_60);
          if (iVar3 != 0) {
            iVar2 = 0;
            if (iVar3 != 0x65) {
              iVar2 = iVar3;
            }
            break;
          }
          iVar2 = fts5NextMethod(&pCursor->base);
        }
        goto LAB_0019463e;
      }
    }
    else {
      local_50 = plVar11 + 4;
      lVar9 = 0;
      iVar2 = local_9c;
      local_90 = puVar10;
      local_80 = p;
      local_68 = pTab;
      while (p = local_80, pPhrase = local_78, iVar2 == 0) {
        iVar2 = (int)local_88[3];
        puVar10 = local_90;
        pTab = local_68;
        if (iVar2 <= lVar9) goto LAB_00194592;
        plVar11 = local_50 + lVar9 * 4;
        iVar2 = 0;
        iVar3 = 0;
        local_48 = plVar11;
        local_40 = lVar9;
        while ((plVar11 != (long *)0x0 && (iVar2 == 0))) {
          __s = (char *)plVar11[1];
          sVar7 = strlen(__s);
          iVar2 = fts5ParseTokenize(&local_78,iVar3,__s,(int)sVar7,in_R8D,in_R9D);
          plVar11 = (long *)plVar11[3];
          iVar3 = 1;
        }
        if (iVar2 == 0) {
          local_78->aTerm[lVar9].bPrefix = (u8)*local_48;
          local_78->aTerm[lVar9].bFirst = *(u8 *)((long)local_48 + 1);
        }
        lVar9 = local_40 + 1;
      }
    }
    sqlite3Fts5ExprFree(p);
    fts5ExprPhraseFree(pPhrase);
    local_98->pExpr = (Fts5Expr *)0x0;
    pCursor = local_98;
  }
LAB_0019463e:
  fts5CloseMethod(&pCursor->base);
  return iVar2;
}

Assistant:

static int fts5ApiQueryPhrase(
  Fts5Context *pCtx, 
  int iPhrase, 
  void *pUserData,
  int(*xCallback)(const Fts5ExtensionApi*, Fts5Context*, void*)
){
  Fts5Cursor *pCsr = (Fts5Cursor*)pCtx;
  Fts5FullTable *pTab = (Fts5FullTable*)(pCsr->base.pVtab);
  int rc;
  Fts5Cursor *pNew = 0;

  rc = fts5OpenMethod(pCsr->base.pVtab, (sqlite3_vtab_cursor**)&pNew);
  if( rc==SQLITE_OK ){
    pNew->ePlan = FTS5_PLAN_MATCH;
    pNew->iFirstRowid = SMALLEST_INT64;
    pNew->iLastRowid = LARGEST_INT64;
    pNew->base.pVtab = (sqlite3_vtab*)pTab;
    rc = sqlite3Fts5ExprClonePhrase(pCsr->pExpr, iPhrase, &pNew->pExpr);
  }

  if( rc==SQLITE_OK ){
    for(rc = fts5CursorFirst(pTab, pNew, 0);
        rc==SQLITE_OK && CsrFlagTest(pNew, FTS5CSR_EOF)==0;
        rc = fts5NextMethod((sqlite3_vtab_cursor*)pNew)
    ){
      rc = xCallback(&sFts5Api, (Fts5Context*)pNew, pUserData);
      if( rc!=SQLITE_OK ){
        if( rc==SQLITE_DONE ) rc = SQLITE_OK;
        break;
      }
    }
  }

  fts5CloseMethod((sqlite3_vtab_cursor*)pNew);
  return rc;
}